

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O1

void __thiscall
jsonnet::internal::StripAllButComments::file
          (StripAllButComments *this,AST **body,Fodder *final_fodder)

{
  pointer pFVar1;
  pointer pFVar2;
  AST *pAVar3;
  pointer pFVar4;
  
  (*(this->super_FmtPass).super_CompilerPass._vptr_CompilerPass[6])();
  (*(this->super_FmtPass).super_CompilerPass._vptr_CompilerPass[1])(this,final_fodder);
  pAVar3 = &Allocator::
            make<jsonnet::internal::LiteralNull,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&>
                      ((this->super_FmtPass).super_CompilerPass.alloc,&(*body)->location,
                       &this->comments)->super_AST;
  *body = pAVar3;
  pFVar1 = (final_fodder->
           super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pFVar2 = (final_fodder->
           super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pFVar4 = pFVar1;
  if (pFVar2 != pFVar1) {
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&pFVar4->comment);
      pFVar4 = pFVar4 + 1;
    } while (pFVar4 != pFVar2);
    (final_fodder->
    super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    )._M_impl.super__Vector_impl_data._M_finish = pFVar1;
  }
  return;
}

Assistant:

virtual void file(AST *&body, Fodder &final_fodder)
    {
        expr(body);
        fodder(final_fodder);
        body = alloc.make<LiteralNull>(body->location, comments);
        final_fodder.clear();
    }